

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxhash.c
# Opt level: O0

unsigned_short sxhash(LispPTR obj)

{
  ushort uVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  LispPTR LVar4;
  LispPTR LVar5;
  OneDArray *obj_00;
  LispPTR *pLVar6;
  RATIO *object_1;
  COMPLEX *object;
  LispPTR contents;
  OneDArray *str;
  uint cell;
  LispPTR obj_local;
  
  if ((obj & 0xfff0000 | 0x10000) == 0xf0000) {
    cell._2_2_ = (ushort)obj;
  }
  else {
    uVar1 = (ushort)(obj >> 0x10);
    switch(*(ushort *)((ulong)(MDStypetbl + (obj >> 9)) ^ 2) & 0x7ff) {
    case 2:
      pLVar6 = NativeAligned4FromLAddr(obj);
      cell._2_2_ = (ushort)*pLVar6;
      break;
    case 3:
      pLVar6 = NativeAligned4FromLAddr(obj);
      cell._2_2_ = (ushort)*pLVar6 ^ (ushort)(*pLVar6 >> 0x10);
      break;
    case 4:
    case 0x15:
      cell._2_2_ = uVar1 ^ (ushort)((obj & 0x1fff) << 3) ^ (ushort)(obj >> 9) & 0x7f;
      break;
    case 5:
      cell._2_2_ = sxhash_list(obj);
      break;
    default:
      cell._2_2_ = uVar1 ^ (ushort)((obj & 0x1fff) << 3) ^ (ushort)(obj >> 9) & 0x7f;
      break;
    case 0xe:
    case 0x10:
      obj_00 = (OneDArray *)NativeAligned4FromLAddr(obj);
      if ((*(ushort *)&obj_00->field_0x6 >> 0xc & 1) == 0) {
        if ((*(ushort *)&obj_00->field_0x6 >> 0xd & 1) == 0) {
          cell._2_2_ = uVar1 ^ (ushort)((obj & 0x1fff) << 3) ^ (ushort)(obj >> 9) & 0x7f;
        }
        else {
          cell._2_2_ = sxhash_bitvec(obj_00);
        }
      }
      else {
        cell._2_2_ = sxhash_string(obj_00);
      }
      break;
    case 0x11:
      pLVar6 = NativeAligned4FromLAddr(obj);
      LVar5 = *pLVar6;
      LVar4 = car(LVar5);
      LVar5 = cdr(LVar5);
      LVar5 = car(LVar5);
      cell._2_2_ = (short)LVar4 + (short)((LVar5 & 0xffff) << 0xc);
      break;
    case 0x12:
      pLVar6 = NativeAligned4FromLAddr(obj);
      uVar2 = sxhash(*pLVar6);
      uVar3 = sxhash(pLVar6[1]);
      cell._2_2_ = uVar2 ^ uVar3;
      break;
    case 0x13:
      pLVar6 = NativeAligned4FromLAddr(obj);
      uVar2 = sxhash(*pLVar6);
      uVar3 = sxhash(pLVar6[1]);
      cell._2_2_ = uVar2 ^ uVar3;
      break;
    case 0x14:
      cell._2_2_ = sxhash_pathname(obj);
    }
  }
  return cell._2_2_;
}

Assistant:

static unsigned short sxhash(LispPTR obj) {
  /* unsigned short hashOffset; Not Used */
  unsigned int cell;
  OneDArray *str;
  switch (SEGMASK & obj) {
    case S_POSITIVE:
    case S_NEGATIVE: return (obj & 0xFFFF);
    default:
      switch (GetTypeNumber(obj)) {
        case TYPE_FIXP: return ((FIXP_VALUE(obj)) & 0xFFFF);
        case TYPE_FLOATP:
          cell = (unsigned int)FIXP_VALUE(obj);
          return ((cell & 0xFFFF) ^ (cell >> 16));
#ifdef BIGATOMS
        case TYPE_NEWATOM: /* as for LITATOM... */
#endif                     /* BIGATOMS */

        case TYPE_LITATOM: return (EQHASHINGBITS(obj));
        case TYPE_LISTP: return (sxhash_list(obj));
        case TYPE_PATHNAME: return (sxhash_pathname(obj));
        case TYPE_ONED_ARRAY:
        case TYPE_GENERAL_ARRAY:
          str = (OneDArray *)NativeAligned4FromLAddr(obj);
          if (str->stringp) return (sxhash_string(str));
          if (str->bitp) return (sxhash_bitvec(str));
          return (EQHASHINGBITS(obj));
        case TYPE_BIGNUM: {
          LispPTR contents;
          contents = ((BIGNUM *)NativeAligned4FromLAddr(obj))->contents;
          return ((unsigned short)car(contents) + (((unsigned short)car(cdr(contents))) << 12));
        }

        case TYPE_COMPLEX: {
          COMPLEX *object;
          object = (COMPLEX *)NativeAligned4FromLAddr(obj);
          return (sxhash(object->real) ^ sxhash(object->imaginary));
        }
        case TYPE_RATIO: {
          RATIO *object;
          object = (RATIO *)NativeAligned4FromLAddr(obj);
          return (sxhash(object->numerator) ^ sxhash(object->denominator));
        }

        default: return (EQHASHINGBITS(obj));
      }
  }
}